

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFVersion.cc
# Opt level: O3

void __thiscall PDFVersion::updateIfGreater(PDFVersion *this,PDFVersion *other)

{
  int iVar1;
  
  if (other->major_version <= this->major_version) {
    if (this->major_version <= other->major_version) {
      if ((this->minor_version < other->minor_version) ||
         ((this->minor_version <= other->minor_version &&
          (this->extension_level < other->extension_level)))) goto LAB_001307d6;
    }
    return;
  }
LAB_001307d6:
  this->extension_level = other->extension_level;
  iVar1 = other->minor_version;
  this->major_version = other->major_version;
  this->minor_version = iVar1;
  return;
}

Assistant:

bool
PDFVersion::operator<(PDFVersion const& rhs) const
{
    return (
        (this->major_version < rhs.major_version)           ? true
            : (this->major_version > rhs.major_version)     ? false
            : (this->minor_version < rhs.minor_version)     ? true
            : (this->minor_version > rhs.minor_version)     ? false
            : (this->extension_level < rhs.extension_level) ? true
                                                            : false);
}